

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::BackgroundScanStack(Recycler *this)

{
  bool bVar1;
  DWORD DVar2;
  void **obj;
  size_t byteCount;
  
  if (this->skipStack == true) {
    bVar1 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,ScanStackPhase);
    if ((bVar1) && (this->recyclerFlagsTable->Verbose == true)) {
      DVar2 = GetCurrentThreadId();
      Output::Print(L"[%04X] Skipping the stack scan\n",(ulong)DVar2);
      Output::Flush();
      return 0;
    }
  }
  else {
    if (this->isInScript != true) {
      return 0;
    }
    if (this->mainThreadHandle == (HANDLE)0x0) {
      return 0;
    }
    obj = (void **)GetScriptThreadStackTop(this);
    if (obj != (void **)0x0) {
      byteCount = (long)this->stackBase - (long)obj;
      ScanMemoryInline<false,false>(this,obj,byteCount);
      return byteCount;
    }
  }
  return 0;
}

Assistant:

size_t
Recycler::BackgroundScanStack()
{
    if (this->skipStack)
    {
#ifdef RECYCLER_TRACE
        CUSTOM_PHASE_PRINT_VERBOSE_TRACE1(GetRecyclerFlagsTable(), Js::ScanStackPhase, _u("[%04X] Skipping the stack scan\n"), ::GetCurrentThreadId());
#endif
        return 0;
    }

    if (!this->isInScript || mainThreadHandle == nullptr)
    {
        // No point in scanning the main thread's stack if we are not in script
        // We also can't scan the main thread's stack if we are not thread bounded, and didn't create the main thread's handle
        return 0;
    }

    char* stackTop = this->GetScriptThreadStackTop();

    if (stackTop != nullptr)
    {
        size_t size = (char *)stackBase - stackTop;
        ScanMemoryInline<false>((void **)stackTop, size
            ADDRESS_SANITIZER_APPEND(RecyclerScanMemoryType::Stack));
        return size;
    }

    return 0;
}